

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *this,dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  size_type sVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  bool bVar8;
  sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *this_00;
  size_type in_RDX;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *in_RDI;
  size_type unaff_retaddr;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *in_stack_00000008;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *in_stack_00000010;
  KeyInfo *in_stack_ffffffffffffffa8;
  sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffe0;
  
  sVar1 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar2 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          shrink_threshold_;
  fVar3 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.shrink_factor_;
  bVar8 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.consider_shrink_
  ;
  bVar4 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_;
  bVar5 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_deleted_;
  uVar6 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.field_0x1b;
  uVar7 = (in_RSI->settings).
          super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.num_ht_copies_;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ =
       (in_RSI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       enlarge_factor_;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = fVar3;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = bVar8;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_empty_ = bVar4;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = bVar5;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  field_0x1b = uVar6;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = uVar7;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = sVar1;
  (in_RDI->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = sVar2;
  KeyInfo::KeyInfo((KeyInfo *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  in_RDI->num_buckets = 0;
  ValInfo::ValInfo((ValInfo *)in_stack_ffffffffffffffb0,(ValInfo *)in_stack_ffffffffffffffa8);
  in_RDI->table = (pointer)0x0;
  bVar8 = sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
          use_empty((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)in_RSI);
  if (bVar8) {
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
    reset_thresholds(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  else {
    size(in_RSI);
    this_00 = (sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)
              sparsehash_internal::
              sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::min_buckets
                        ((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)
                         in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    in_RDI->num_buckets = (size_type)this_00;
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
    reset_thresholds(this_00,(size_type)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }